

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,Field *params)

{
  int iVar1;
  SegmentReader *pSVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint uVar6;
  Entry *pEVar7;
  ulong uVar8;
  Field *in_R8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  aVar4.value = table.size_;
  pEVar7 = table.ptr;
  aVar5.value = aVar4.value;
  if ((pEVar7->key).proto._reader.capTable != (CapTableReader *)0x0) {
    uVar3 = capnp::StructSchema::Field::hashCode(in_R8);
    pSVar2 = (pEVar7->key).proto._reader.segment;
    aVar5 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (pEVar7->key).proto._reader.capTable;
    uVar6 = (int)aVar5.value - 1U & uVar3;
    while( true ) {
      uVar8 = (ulong)uVar6;
      iVar1 = *(int *)((long)&pSVar2->arena + uVar8 * 8 + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(&pSVar2->arena + uVar8) == uVar3)) {
        uVar9 = (ulong)(iVar1 - 2);
        if (((RawBrandedSchema *)
             ((CapTableReader *)(aVar4.value + uVar9 * 0x48))->_vptr_CapTableReader ==
             (in_R8->parent).super_Schema.raw) &&
           (*(uint *)&((CapTableReader *)(aVar4.value + 8))[uVar9 * 9]._vptr_CapTableReader ==
            in_R8->index)) {
          *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = uVar9;
          goto LAB_0016d3f0;
        }
      }
      uVar6 = (uint)(CapTableReader *)(uVar8 + 1);
      if ((CapTableReader *)(uVar8 + 1) == (CapTableReader *)aVar5.value) {
        uVar6 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           )0x0;
LAB_0016d3f0:
  MVar10.ptr.field_1.value = aVar5.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }